

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

Boxed_Value *
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Caller<chaiscript::Boxed_Value&,chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&,0ul,1ul>
          (undefined8 param_1,ulong *param_2,long *param_3,Type_Conversions_State *param_4)

{
  Result_Type RVar1;
  code *pcVar2;
  Boxed_Value *pBVar3;
  long *plVar4;
  Result_Type RVar5;
  chaiscript local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  RVar1 = boxed_cast<chaiscript::Boxed_Value&>((Boxed_Value *)*param_3,param_4);
  RVar5 = boxed_cast<chaiscript::Boxed_Value_const&>
                    (local_30,(Boxed_Value *)(*param_3 + 0x10),param_4);
  pcVar2 = (code *)*param_2;
  plVar4 = (long *)((long)&((RVar1._M_data)->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + param_2[1]);
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *plVar4 + -1);
  }
  pBVar3 = (Boxed_Value *)
           (*pcVar2)(plVar4,local_30,
                     RVar5.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return pBVar3;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }